

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O2

int lys_set_disabled(lys_module *module)

{
  byte *pbVar1;
  uint16_t *puVar2;
  lys_node **pplVar3;
  ushort uVar4;
  lys_module **pplVar5;
  lys_module *plVar6;
  lys_node *plVar7;
  long lVar8;
  ly_set *set;
  char *format;
  long lVar9;
  ly_ctx *ctx;
  ulong uVar10;
  char *pcVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  
  if (module == (lys_module *)0x0) {
    format = "Invalid arguments (%s()).";
    pcVar11 = "lys_set_disabled";
    ctx = (ly_ctx *)0x0;
  }
  else {
    if ((*(ushort *)&module->field_0x40 & 0x40) != 0) {
      return 0;
    }
    ctx = module->ctx;
    uVar14 = 0;
    do {
      if (ctx->internal_module_count == uVar14) {
        *(ushort *)&module->field_0x40 = *(ushort *)&module->field_0x40 | 0x40;
        set = ly_set_new();
LAB_0010d13a:
        ly_set_add(set,module,0);
LAB_0010d144:
        uVar14 = (ulong)ctx->internal_module_count;
        do {
          lVar9 = (long)(ctx->models).used;
          if (lVar9 <= (long)uVar14) {
            for (uVar14 = 0; uVar14 < set->number; uVar14 = uVar14 + 1) {
              pplVar3 = &(set->set).s[uVar14]->parent;
              *(ushort *)pplVar3 = *(ushort *)pplVar3 & 0xffbf;
            }
            ctx_modules_undo_backlinks(ctx,set);
            uVar14 = (ulong)set->number;
            while (bVar15 = uVar14 != 0, uVar14 = uVar14 - 1, bVar15) {
              lys_sub_module_remove_devs_augs((lys_module *)(set->set).s[uVar14]);
            }
            for (uVar14 = 0; uVar14 < set->number; uVar14 = uVar14 + 1) {
              plVar7 = (set->set).s[uVar14];
              *(ushort *)&plVar7->parent = *(ushort *)&plVar7->parent | 0x40;
              lVar9 = 0;
              for (uVar10 = 0; uVar10 < *(byte *)((long)&plVar7->parent + 6); uVar10 = uVar10 + 1) {
                pbVar1 = (byte *)(*(long *)(*(long *)plVar7->hash + lVar9) + 0x40);
                *pbVar1 = *pbVar1 | 0x40;
                lVar9 = lVar9 + 0x30;
              }
            }
            ly_set_free(set);
            puVar2 = &(ctx->models).module_set_id;
            *puVar2 = *puVar2 + 1;
            return 0;
          }
          pplVar5 = (ctx->models).list;
          module = pplVar5[uVar14];
          uVar4 = *(ushort *)&module->field_0x40;
          if ((uVar4 & 0x40) == 0) {
            for (uVar10 = 0; uVar10 != module->imp_size; uVar10 = uVar10 + 1) {
              uVar13 = 0;
              while (set->number != uVar13) {
                pplVar3 = (set->set).s + uVar13;
                uVar13 = uVar13 + 1;
                if (module->imp[uVar10].module == (lys_module *)*pplVar3) {
                  *(ushort *)&module->field_0x40 = uVar4 | 0x40;
                  goto LAB_0010d13a;
                }
              }
            }
            if (-1 < (char)uVar4) {
              for (uVar10 = (ulong)ctx->internal_module_count; (long)uVar10 < lVar9;
                  uVar10 = uVar10 + 1) {
                plVar6 = pplVar5[uVar10];
                if ((plVar6->field_0x40 & 0x40) == 0) {
                  lVar12 = 0;
                  while ((ulong)plVar6->imp_size * 0x38 + 0x38 != lVar12 + 0x38) {
                    lVar8 = lVar12 + -0x10;
                    lVar12 = lVar12 + 0x38;
                    if (*(lys_module **)(plVar6->imp->rev + lVar8) == module) goto LAB_0010d21a;
                  }
                }
              }
              *(ushort *)&module->field_0x40 = uVar4 | 0x40;
              ly_set_add(set,module,0);
              if (module->imp_size != '\0') goto LAB_0010d144;
            }
          }
LAB_0010d21a:
          uVar14 = uVar14 + 1;
        } while( true );
      }
      pplVar5 = (ctx->models).list + uVar14;
      uVar14 = uVar14 + 1;
    } while (*pplVar5 != module);
    pcVar11 = module->name;
    format = "Internal module \"%s\" cannot be disabled.";
  }
  ly_log(ctx,LY_LLERR,LY_EINVAL,format,pcVar11);
  return 1;
}

Assistant:

API int
lys_set_disabled(const struct lys_module *module)
{
    struct ly_ctx *ctx; /* shortcut */
    struct lys_module *mod;
    struct ly_set *mods;
    uint8_t j, imported;
    int i, o;
    unsigned int u, v;

    if (!module) {
        LOGARG;
        return EXIT_FAILURE;
    } else if (module->disabled) {
        /* already disabled module */
        return EXIT_SUCCESS;
    }
    mod = (struct lys_module *)module;
    ctx = mod->ctx;

    /* avoid disabling internal modules */
    for (i = 0; i < ctx->internal_module_count; i++) {
        if (mod == ctx->models.list[i]) {
            LOGERR(ctx, LY_EINVAL, "Internal module \"%s\" cannot be disabled.", mod->name);
            return EXIT_FAILURE;
        }
    }

    /* disable the module */
    mod->disabled = 1;

    /* get the complete list of modules to disable because of dependencies,
     * we are going also to disable all the imported (not implemented) modules
     * that are not used in any other module */
    mods = ly_set_new();
    ly_set_add(mods, mod, 0);
checkdependency:
    for (i = ctx->internal_module_count; i < ctx->models.used; i++) {
        mod = ctx->models.list[i]; /* shortcut */
        if (mod->disabled) {
            /* skip the already disabled modules */
            continue;
        }

        /* check depndency of imported modules */
        for (j = 0; j < mod->imp_size; j++) {
            for (u = 0; u < mods->number; u++) {
                if (mod->imp[j].module == mods->set.g[u]) {
                    /* module is importing some module to disable, so it must be also disabled */
                    mod->disabled = 1;
                    ly_set_add(mods, mod, 0);
                    /* we have to start again because some of the already checked modules can
                     * depend on the one we have just decided to disable */
                    goto checkdependency;
                }
            }
        }
        /* check if the imported module is used in any module supposed to be kept */
        if (!mod->implemented) {
            imported = 0;
            for (o = ctx->internal_module_count; o < ctx->models.used; o++) {
                if (ctx->models.list[o]->disabled) {
                    /* skip modules already disabled */
                    continue;
                }
                for (j = 0; j < ctx->models.list[o]->imp_size; j++) {
                    if (ctx->models.list[o]->imp[j].module == mod) {
                        /* the module is used in some other module not yet selected to be disabled */
                        imported = 1;
                        goto imported;
                    }
                }
            }
imported:
            if (!imported) {
                /* module is not implemented and neither imported by any other module in context
                 * which is supposed to be kept enabled after this operation, so we are going to disable also
                 * this module */
                mod->disabled = 1;
                ly_set_add(mods, mod, 0);
                /* we have to start again, this time not because other module can depend on this one
                 * (we know that there is no such module), but because the module can import module
                 * that could became useless. If there are no imports, we can continue */
                if (mod->imp_size) {
                    goto checkdependency;
                }
            }
        }
    }

    /* before removing applied deviations, augments and updating leafrefs, we have to enable the modules
     * to disable to allow all that operations */
    for (u = 0; u < mods->number; u++) {
        ((struct lys_module *)mods->set.g[u])->disabled = 0;
    }

    /* maintain backlinks (start with internal ietf-yang-library which have leafs as possible targets of leafrefs */
    ctx_modules_undo_backlinks(ctx, mods);

    /* remove the applied deviations and augments */
    u = mods->number;
    while (u--) {
        lys_sub_module_remove_devs_augs((struct lys_module *)mods->set.g[u]);
    }

    /* now again disable the modules to disable and disable also all its submodules */
    for (u = 0; u < mods->number; u++) {
        mod = (struct lys_module *)mods->set.g[u];
        mod->disabled = 1;
        for (v = 0; v < mod->inc_size; v++) {
            mod->inc[v].submodule->disabled = 1;
        }
    }

    /* free the set */
    ly_set_free(mods);

    /* update the module-set-id */
    ctx->models.module_set_id++;

    return EXIT_SUCCESS;
}